

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void init_films(void)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  undefined1 append_for_moving_window;
  double dVar4;
  double dVar5;
  undefined8 uVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double unaff_retaddr;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000028;
  film *tmp_p_film;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffffa8;
  undefined7 in_stack_fffffffffffffff0;
  bool bVar13;
  film *local_8;
  
  for (local_8 = p_last_film; local_8 != (film *)0x0; local_8 = local_8->prev) {
    if (((local_8->xnpic_film == 0) || (local_8->ynpic_film == 0)) || (local_8->znpic_film == 0)) {
      local_8->xnpic_film = xnpic;
      local_8->ynpic_film = ynpic;
      local_8->znpic_film = znpic;
    }
    if ((local_8->ne != 0.0) || (NAN(local_8->ne))) {
      local_8->ne_y0 = local_8->ne;
      local_8->ne_y1 = local_8->ne;
    }
    std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
              ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x1468b3);
    dVar5 = dx;
    dVar4 = local_8->x0;
    uVar8 = 0;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)mpi_rank);
    dVar1 = dx;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar4;
    auVar6._0_8_ = (double)*pvVar3;
    auVar6._8_8_ = uVar8;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = -dVar5;
    vfmadd213sd_fma(auVar6,auVar9,auVar11);
    dVar4 = local_8->x0;
    dVar5 = local_8->filmwidth;
    uVar8 = 0;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)mpi_rank);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar4 + dVar5;
    auVar7._0_8_ = (double)*pvVar3;
    auVar7._8_8_ = uVar8;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = -dVar1;
    auVar6 = vfmadd213sd_fma(auVar7,auVar10,auVar12);
    append_for_moving_window = auVar6[7];
    dVar4 = local_8->ne_y0 / ((11148500000000.0 / lambda) / lambda);
    dVar5 = local_8->ne_y1 / ((11148500000000.0 / lambda) / lambda);
    bVar2 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff28 = (char *)local_8->z0;
    in_stack_ffffffffffffff30 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8->z1;
    bVar13 = true;
    if ((nelflow == 0.0) && (!NAN(nelflow))) {
      bVar13 = nerflow != 0.0;
    }
    spatial_region::film
              ((spatial_region *)CONCAT17(bVar13,in_stack_fffffffffffffff0),local_8->vx,local_8->T,
               (double)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28,
               (int)((ulong)local_8->y1 >> 0x20),local_8->y0,local_8->gradwidth,
               1.0 / (local_8->mcr * 1836.1526721),
               (double)(ulong)CONCAT14(bVar2,in_stack_ffffffffffffffa8),unaff_retaddr,
               in_stack_00000008,in_stack_00000010,in_stack_00000018,SUB81((ulong)dVar5 >> 0x38,0),
               SUB84(dVar5,0),(int)((ulong)dVar4 >> 0x20),SUB84(dVar4,0),
               (bool)append_for_moving_window,in_stack_00000028);
  }
  return;
}

Assistant:

void init_films()
{
    film* tmp_p_film = p_last_film;
    while (tmp_p_film!=0)
    {
        /* x0film - координата левой границы плёнки, filmwidth - её
         * толщина, gradwidth - толщина части плёнки с линейным ростом
         * плотности */
        if (tmp_p_film->xnpic_film == 0 || tmp_p_film->ynpic_film == 0 || tmp_p_film->znpic_film == 0)
        {
            tmp_p_film->xnpic_film = xnpic;
            tmp_p_film->ynpic_film = ynpic;
            tmp_p_film->znpic_film = znpic;
        }
        if (tmp_p_film->ne != 0)
        {
            tmp_p_film->ne_y0 = tmp_p_film->ne;
            tmp_p_film->ne_y1 = tmp_p_film->ne;
        }

        psr->film(
            tmp_p_film->x0-dx*x0_sr[mpi_rank], 
            tmp_p_film->x0+tmp_p_film->filmwidth-dx*x0_sr[mpi_rank],
            tmp_p_film->ne_y0/(1.11485e+13/lambda/lambda),
            tmp_p_film->ne_y1/(1.11485e+13/lambda/lambda),
            ions == "on",
            1/(proton_mass*tmp_p_film->mcr),
            tmp_p_film->gradwidth,
            tmp_p_film->y0,
            tmp_p_film->y1,
            tmp_p_film->z0,
            tmp_p_film->z1,
            tmp_p_film->T,
            tmp_p_film->vx,
            nelflow != 0 || nerflow != 0,
            tmp_p_film->xnpic_film,
            tmp_p_film->ynpic_film,
            tmp_p_film->znpic_film,
            false,
            tmp_p_film->gradwidth_y
        );
        tmp_p_film = tmp_p_film->prev;
    }
}